

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

_Bool ec_ed_alg_and_curve_by_bits(int bits,ec_curve **curve,ssh_keyalg **alg)

{
  ssh_keyalg *psVar1;
  ec_curve *peVar2;
  
  if (bits - 0xffU < 2) {
    psVar1 = &ssh_ecdsa_ed25519;
  }
  else {
    if (bits != 0x1c0) {
      return false;
    }
    psVar1 = &ssh_ecdsa_ed448;
  }
  *alg = psVar1;
  peVar2 = (ec_curve *)(**psVar1->extra)();
  *curve = peVar2;
  return true;
}

Assistant:

bool ec_ed_alg_and_curve_by_bits(
    int bits, const struct ec_curve **curve, const ssh_keyalg **alg)
{
    switch (bits) {
      case 255: case 256: *alg = &ssh_ecdsa_ed25519; break;
      case 448: *alg = &ssh_ecdsa_ed448; break;
      default: return false;
    }
    *curve = ((struct ecsign_extra *)(*alg)->extra)->curve();
    return true;
}